

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

Reg __thiscall backend::codegen::Codegen::get_or_alloc_vd(Codegen *this,VarId *v_)

{
  map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  *this_00;
  RegisterKind RVar1;
  Reg RVar2;
  iterator iVar3;
  VarId v;
  undefined1 auStack_68 [24];
  uint32_t local_50;
  Reg local_48;
  undefined **local_40;
  uint32_t local_38;
  
  local_40 = &PTR_display_001d90d0;
  local_38 = v_->id;
  get_collapsed_var((Codegen *)auStack_68,(VarId *)this);
  this_00 = &this->reg_map;
  iVar3 = std::
          _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_unsigned_int>,_std::_Select1st<std::pair<const_mir::inst::VarId,_unsigned_int>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
          ::find(&this_00->_M_t,(key_type *)auStack_68);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->reg_map)._M_t._M_impl.super__Rb_tree_header) {
    RVar2 = alloc_vd(this);
    auStack_68._16_8_ = &PTR_display_001d90d0;
    local_50 = auStack_68._8_4_;
    local_48 = RVar2;
    std::
    _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
    ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
              ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
                *)this_00,(pair<const_mir::inst::VarId,_unsigned_int> *)(auStack_68 + 0x10));
    local_50 = v_->id;
    if (local_50 != auStack_68._8_4_) {
      auStack_68._16_8_ = &PTR_display_001d90d0;
      local_48 = RVar2;
      std::
      _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
      ::_M_insert_unique<std::pair<mir::inst::VarId_const,unsigned_int>>
                ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,unsigned_int>,std::_Select1st<std::pair<mir::inst::VarId_const,unsigned_int>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,unsigned_int>>>
                  *)this_00,(pair<const_mir::inst::VarId,_unsigned_int> *)(auStack_68 + 0x10));
    }
  }
  else {
    RVar1 = arm::register_type(*(Reg *)&iVar3._M_node[1]._M_left);
    if (RVar1 != VirtualDoubleVector) {
      __assert_fail("arm::register_type(found->second) == arm::RegisterKind::VirtualDoubleVector",
                    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.cpp"
                    ,0x135,"arm::Reg backend::codegen::Codegen::get_or_alloc_vd(mir::inst::VarId)");
    }
    RVar2 = *(Reg *)&iVar3._M_node[1]._M_left;
  }
  return RVar2;
}

Assistant:

arm::Reg Codegen::get_or_alloc_vd(mir::inst::VarId v_) {
  auto v = get_collapsed_var(v_);
  auto found = reg_map.find(v);
  if (found != reg_map.end()) {
    assert(arm::register_type(found->second) ==
           arm::RegisterKind::VirtualDoubleVector);
    return found->second;
  } else {
    auto reg = alloc_vd();
    reg_map.insert({v, reg});
    if (v_ != v) reg_map.insert({v_, reg});
    return reg;
  }
}